

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

ExprP<tcu::Vector<float,_3>_> __thiscall
vkt::shaderexecutor::
createApply<vkt::shaderexecutor::Signature<tcu::Vector<float,3>,tcu::Vector<float,3>,tcu::Vector<float,3>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
          (shaderexecutor *this,
          Func<vkt::shaderexecutor::Signature<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
          *func,ExprP<tcu::Vector<float,_3>_> *arg0,ExprP<tcu::Vector<float,_3>_> *arg1,
          ExprP<vkt::shaderexecutor::Void> *arg2,ExprP<vkt::shaderexecutor::Void> *arg3)

{
  Expr<tcu::Vector<float,_3>_> *ptr;
  ExprP<tcu::Vector<float,_3>_> EVar1;
  
  ptr = (Expr<tcu::Vector<float,_3>_> *)operator_new(0x50);
  (ptr->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__Apply_00d37238;
  ptr[1].super_ExprBase._vptr_ExprBase = (_func_int **)func;
  Tuple4<vkt::shaderexecutor::ExprP<tcu::Vector<float,_3>_>,_vkt::shaderexecutor::ExprP<tcu::Vector<float,_3>_>,_vkt::shaderexecutor::ExprP<vkt::shaderexecutor::Void>,_vkt::shaderexecutor::ExprP<vkt::shaderexecutor::Void>_>
  ::Tuple4((Tuple4<vkt::shaderexecutor::ExprP<tcu::Vector<float,_3>_>,_vkt::shaderexecutor::ExprP<tcu::Vector<float,_3>_>,_vkt::shaderexecutor::ExprP<vkt::shaderexecutor::Void>,_vkt::shaderexecutor::ExprP<vkt::shaderexecutor::Void>_>
            *)(ptr + 2),arg0,arg1,arg2,arg3);
  EVar1 = exprP<tcu::Vector<float,3>>(this,ptr);
  EVar1.super_ContainerExprPBase<tcu::Vector<float,_3>_>.super_ExprPBase<tcu::Vector<float,_3>_>.
  super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_3>_>_>.m_ptr =
       (Expr<tcu::Vector<float,_3>_> *)this;
  return (ExprP<tcu::Vector<float,_3>_>)
         EVar1.super_ContainerExprPBase<tcu::Vector<float,_3>_>.
         super_ExprPBase<tcu::Vector<float,_3>_>.
         super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_3>_>_>;
}

Assistant:

ExprP<typename Sig::Ret> createApply (
	const Func<Sig>&			func,
	const ExprP<typename Sig::Arg0>&	arg0 = voidP(),
	const ExprP<typename Sig::Arg1>&	arg1 = voidP(),
	const ExprP<typename Sig::Arg2>&	arg2 = voidP(),
	const ExprP<typename Sig::Arg3>&	arg3 = voidP())
{
	return exprP(new Apply<Sig>(func, arg0, arg1, arg2, arg3));
}